

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::InitializeProfileAllocTracker(Recycler *this)

{
  bool bVar1;
  NoCheckHeapAllocator *alloc;
  BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  CriticalSection *this_01;
  TrackAllocData local_38;
  Recycler *local_10;
  Recycler *this_local;
  
  local_10 = this;
  bVar1 = DoProfileAllocTracker();
  if (bVar1) {
    TrackAllocData::CreateTrackAllocData
              (&local_38,
               (type_info *)
               &JsUtil::
                BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
               ,0x1fea);
    alloc = NoCheckHeapAllocator::TrackAllocInfo
                      ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,&local_38);
    this_00 = (BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::NoCheckHeapAllocator>(0x38,alloc,0x25f760);
    JsUtil::
    BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,(AllocatorType *)&NoCheckHeapAllocator::Instance,0xa3);
    this->trackerDictionary = this_00;
    this_01 = (CriticalSection *)operator_new(0x40);
    CriticalSection::CriticalSection(this_01,1000);
    this->trackerCriticalSection = this_01;
  }
  TrackAllocData::Clear(&this->nextAllocData);
  return;
}

Assistant:

void
Recycler::InitializeProfileAllocTracker()
{
    if (DoProfileAllocTracker())
    {
        trackerDictionary = NoCheckHeapNew(TypeInfotoTrackerItemMap, &NoCheckHeapAllocator::Instance, 163);
        trackerCriticalSection = new CriticalSection(1000);
#pragma prefast(suppress:6031, "InitializeCriticalSectionAndSpinCount always succeed since Vista. No need to check return value");
    }

    nextAllocData.Clear();
}